

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

PrimitiveTestClass * __thiscall
PrimitiveTestClass::operator=(PrimitiveTestClass *this,PrimitiveTestClass *other)

{
  size_t __n;
  size_t __n_00;
  int iVar1;
  undefined8 uVar2;
  size_t __n_01;
  unsigned_long uVar3;
  unsigned_long_long uVar4;
  unsigned_short uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  uchar *__dest;
  short *__dest_00;
  unsigned_short *__dest_01;
  int *__dest_02;
  uint *__dest_03;
  long *__dest_04;
  unsigned_long *__dest_05;
  longlong *__dest_06;
  unsigned_long_long *__dest_07;
  float *__dest_08;
  double *__dest_09;
  longdouble *__dest_10;
  ulong *puVar12;
  ulong *puVar13;
  shared_ptr<TestArrObj> *this_00;
  ulong __n_02;
  ulong uVar14;
  long lVar15;
  
  this->c = other->c;
  this->uc = other->uc;
  uVar5 = other->us;
  this->s = other->s;
  this->us = uVar5;
  uVar6 = other->ui;
  this->i = other->i;
  this->ui = uVar6;
  uVar3 = other->ul;
  this->l = other->l;
  this->ul = uVar3;
  uVar4 = other->ull;
  this->ll = other->ll;
  this->ull = uVar4;
  this->f = other->f;
  this->d = other->d;
  this->ld = other->ld;
  pcVar7 = (char *)operator_new__(0xd);
  this->str = pcVar7;
  uVar2 = *(undefined8 *)(other->str + 5);
  *(undefined8 *)pcVar7 = *(undefined8 *)other->str;
  *(undefined8 *)(pcVar7 + 5) = uVar2;
  iVar1 = this->SIZE;
  __n_02 = (ulong)iVar1;
  lVar15 = __n_02 * 0x20;
  uVar14 = 0xffffffffffffffff;
  uVar8 = lVar15 + 8;
  if ((long)__n_02 < 0) {
    uVar8 = uVar14;
  }
  sVar9 = __n_02 << 4;
  if ((long)__n_02 < 0) {
    sVar9 = uVar14;
  }
  __n = __n_02 * 8;
  sVar10 = __n;
  if ((long)__n_02 < 0) {
    sVar10 = uVar14;
  }
  __n_00 = __n_02 * 4;
  sVar11 = __n_00;
  if ((long)__n_02 < 0) {
    sVar11 = uVar14;
  }
  __n_01 = __n_02 * 2;
  if (-1 < (long)__n_02) {
    uVar14 = __n_01;
  }
  pcVar7 = (char *)operator_new__(__n_02);
  this->pc = pcVar7;
  memcpy(pcVar7,other->pc,__n_02);
  __dest = (uchar *)operator_new__(__n_02);
  this->puc = __dest;
  memcpy(__dest,other->puc,__n_02);
  __dest_00 = (short *)operator_new__(uVar14);
  this->ps = __dest_00;
  memcpy(__dest_00,other->ps,__n_01);
  __dest_01 = (unsigned_short *)operator_new__(uVar14);
  this->pus = __dest_01;
  memcpy(__dest_01,other->pus,__n_01);
  __dest_02 = (int *)operator_new__(sVar11);
  this->pi = __dest_02;
  memcpy(__dest_02,other->pi,__n_00);
  __dest_03 = (uint *)operator_new__(sVar11);
  this->pui = __dest_03;
  memcpy(__dest_03,other->pui,__n_00);
  __dest_04 = (long *)operator_new__(sVar10);
  this->pl = __dest_04;
  memcpy(__dest_04,other->pl,__n);
  __dest_05 = (unsigned_long *)operator_new__(sVar10);
  this->pul = __dest_05;
  memcpy(__dest_05,other->pul,__n);
  __dest_06 = (longlong *)operator_new__(sVar10);
  this->pll = __dest_06;
  memcpy(__dest_06,other->pll,__n);
  __dest_07 = (unsigned_long_long *)operator_new__(sVar10);
  this->pull = __dest_07;
  memcpy(__dest_07,other->pull,__n);
  __dest_08 = (float *)operator_new__(sVar11);
  this->pf = __dest_08;
  memcpy(__dest_08,other->pf,__n_00);
  __dest_09 = (double *)operator_new__(sVar10);
  this->pd = __dest_09;
  memcpy(__dest_09,other->pd,__n);
  __dest_10 = (longdouble *)operator_new__(sVar9);
  this->pld = __dest_10;
  memcpy(__dest_10,other->pld,__n_02 << 4);
  puVar12 = (ulong *)operator_new__(uVar8);
  *puVar12 = __n_02;
  if (__n_02 == 0) {
    this->pto = (TestArrObj *)(puVar12 + 1);
  }
  else {
    puVar13 = puVar12 + 3;
    do {
      puVar13[-2] = (ulong)puVar13;
      puVar13[-1] = 0;
      *(undefined1 *)puVar13 = 0;
      puVar13 = puVar13 + 4;
      lVar15 = lVar15 + -0x20;
    } while (lVar15 != 0);
    this->pto = (TestArrObj *)(puVar12 + 1);
    if (iVar1 != 0) {
      lVar15 = 0;
      uVar14 = 0;
      do {
        std::__cxx11::string::_M_assign
                  ((string *)((long)&(this->pto->str)._M_dataplus._M_p + lVar15));
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 0x20;
      } while (uVar14 < (ulong)(long)this->SIZE);
    }
  }
  std::shared_ptr<int>::operator=(&this->spi,&other->spi);
  this_00 = &this->spto;
  std::shared_ptr<TestArrObj>::operator=(this_00,&other->spto);
  if ((ulong)this_00 >> 0x3d != 0) {
    std::__throw_bad_array_new_length();
  }
  std::__throw_bad_alloc();
}

Assistant:

PrimitiveTestClass &operator=(const PrimitiveTestClass &other)
        {
            c = other.c;
            uc = other.uc;
            s = other.s;
            us = other.us;
            i = other.i;
            ui = other.ui;
            l = other.l;
            ul = other.ul;
            ll = other.ll;
            ull = other.ull;
            f = other.f;
            d = other.d;
            ld = other.ld;

            str = new char[strlen("Hello World!") + 1];
            memcpy(str, other.str, strlen("Hello World!") + 1);

            pc = new char[SIZE];
            memcpy(pc, other.pc, SIZE);
            puc = new unsigned char[SIZE];
            memcpy(puc, other.puc, SIZE);
            ps = new short[SIZE];
            memcpy(ps, other.ps, SIZE * sizeof(short));
            pus = new unsigned short[SIZE];
            memcpy(pus, other.pus, SIZE * sizeof(unsigned short));
            pi = new int[SIZE];
            memcpy(pi, other.pi, SIZE * sizeof(int));
            pui = new unsigned int[SIZE];
            memcpy(pui, other.pui, SIZE * sizeof(unsigned int));
            pl = new long[SIZE];
            memcpy(pl, other.pl, SIZE * sizeof(long));
            pul = new unsigned long[SIZE];
            memcpy(pul, other.pul, SIZE * sizeof(unsigned long));
            pll = new long long[SIZE];
            memcpy(pll, other.pll, SIZE * sizeof(long long));
            pull = new unsigned long long[SIZE];
            memcpy(pull, other.pull, SIZE * sizeof(unsigned long long));
            pf = new float[SIZE];
            memcpy(pf, other.pf, SIZE * sizeof(float));
            pd = new double[SIZE];
            memcpy(pd, other.pd, SIZE * sizeof(double));
            pld = new long double[SIZE];
            memcpy(pld, other.pld, SIZE * sizeof(long double));

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i] = other.pto[i];
            }

            spi = other.spi;
            spto = other.spto;
        }